

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config_inl.hpp
# Opt level: O0

string * __thiscall
CLI::ConfigBase::to_config
          (string *__return_storage_ptr__,ConfigBase *this,App *app,bool default_also,
          bool write_description,string *prefix)

{
  Option *this_00;
  App *pAVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  reference ppOVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  reference ppAVar7;
  ulong uVar8;
  size_t sVar9;
  string *psVar10;
  App *pAVar11;
  ostream *poVar12;
  fpos<__mbstate_t> fVar13;
  byte local_af1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_898;
  string local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  string local_838;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  undefined1 local_7d8 [8];
  string outString;
  string local_7b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  string local_750 [39];
  allocator local_729;
  string local_728 [32];
  string local_708 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  undefined1 local_6a8 [8];
  string pname;
  App *p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  undefined1 local_640 [8];
  string appname;
  string subname;
  App *subcom_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *__range1_2;
  string local_5c0 [32];
  App *local_5a0;
  App *subcom;
  iterator __end1_1;
  iterator __begin1_1;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *__range1_1;
  undefined1 local_560 [8];
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands;
  undefined1 local_528 [8];
  string name;
  string local_4e8;
  fpos<__mbstate_t> local_4c8;
  fpos<__mbstate_t> local_4b8 [3];
  ArgumentMismatch *anon_var_0_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *test_name;
  const_iterator __end7;
  const_iterator __begin7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range7;
  bool valid;
  ArgumentMismatch *anon_var_0;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  byte local_369;
  undefined1 local_368 [7];
  bool isDefault;
  string value;
  results_t results;
  string single_name;
  Option *opt;
  __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
  local_300;
  iterator __end2;
  iterator __begin2;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_2d0;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *local_2b8;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *group;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  allocator local_281;
  value_type local_280;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_260;
  const_iterator local_258;
  byte local_249;
  undefined1 local_248 [7];
  bool defaultUsed;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  string keyChars;
  string local_208 [8];
  string commentTest;
  undefined1 local_1d8 [8];
  string commentLead;
  stringstream out;
  ostream local_1a8 [376];
  string *local_30;
  string *prefix_local;
  bool write_description_local;
  App *pAStack_20;
  bool default_also_local;
  App *app_local;
  ConfigBase *this_local;
  
  local_30 = prefix;
  prefix_local._6_1_ = write_description;
  prefix_local._7_1_ = default_also;
  pAStack_20 = app;
  app_local = (App *)this;
  this_local = (ConfigBase *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream((stringstream *)(commentLead.field_2._M_local_buf + 8))
  ;
  ::std::__cxx11::string::string((string *)local_1d8);
  ::std::__cxx11::string::push_back((char)(string *)local_1d8);
  ::std::__cxx11::string::push_back((char)local_1d8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_208,"#;",(allocator *)(keyChars.field_2._M_local_buf + 0xf));
  ::std::allocator<char>::~allocator((allocator<char> *)(keyChars.field_2._M_local_buf + 0xf));
  ::std::__cxx11::string::push_back((char)local_208);
  ::std::__cxx11::string::push_back((char)local_208);
  ::std::__cxx11::string::string
            ((string *)
             &groups.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_208);
  ::std::__cxx11::string::push_back((char)&groups + '\x10');
  ::std::__cxx11::string::push_back((char)&groups + '\x10');
  ::std::__cxx11::string::push_back((char)&groups + '\x10');
  ::std::__cxx11::string::push_back((char)&groups + '\x10');
  ::std::__cxx11::string::push_back((char)&groups + '\x10');
  ::std::__cxx11::string::push_back((char)&groups + '\x10');
  App::get_groups_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_248,pAStack_20);
  local_249 = 0;
  local_260._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_248);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_258,&local_260);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_280,"OPTIONS",&local_281);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_248,local_258,&local_280);
  ::std::__cxx11::string::~string((string *)&local_280);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_281);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_248);
  group = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_248);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&group);
    pAVar1 = pAStack_20;
    if (!bVar3) break;
    __range2 = (vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
               __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __range2,"OPTIONS");
    if (bVar3) {
LAB_00120c55:
      if ((local_249 & 1) == 0) {
        local_249 = 1;
        goto LAB_00120d30;
      }
    }
    else {
      uVar8 = ::std::__cxx11::string::empty();
      if ((uVar8 & 1) != 0) goto LAB_00120c55;
LAB_00120d30:
      if ((prefix_local._6_1_ & 1) != 0) {
        bVar3 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__range2,"OPTIONS");
        if (bVar3) {
          uVar8 = ::std::__cxx11::string::empty();
          if ((uVar8 & 1) == 0) {
            poVar12 = ::std::operator<<(local_1a8,'\n');
            poVar12 = ::std::operator<<(poVar12,this->commentChar);
            poVar12 = ::std::operator<<(poVar12,(string *)local_1d8);
            poVar12 = ::std::operator<<(poVar12,(string *)__range2);
            ::std::operator<<(poVar12," Options\n");
          }
        }
      }
      pAVar1 = pAStack_20;
      std::function<bool_(const_CLI::Option_*)>::function
                ((function<bool_(const_CLI::Option_*)> *)&__begin2);
      App::get_options(&local_2d0,pAVar1,(function<bool_(const_CLI::Option_*)> *)&__begin2);
      std::function<bool_(const_CLI::Option_*)>::~function
                ((function<bool_(const_CLI::Option_*)> *)&__begin2);
      local_2b8 = &local_2d0;
      __end2 = std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::begin
                         (local_2b8);
      local_300._M_current =
           (Option **)
           std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::end(local_2b8);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=(&__end2,&local_300);
        if (!bVar3) break;
        ppOVar6 = __gnu_cxx::
                  __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                  ::operator*(&__end2);
        this_00 = *ppOVar6;
        bVar3 = OptionBase<CLI::Option>::get_configurable(&this_00->super_OptionBase<CLI::Option>);
        if (bVar3) {
          psVar10 = OptionBase<CLI::Option>::get_group_abi_cxx11_
                              (&this_00->super_OptionBase<CLI::Option>);
          bVar3 = ::std::operator!=(psVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)__range2);
          if (bVar3) {
            bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__range2,"OPTIONS");
            if (bVar3) {
              OptionBase<CLI::Option>::get_group_abi_cxx11_(&this_00->super_OptionBase<CLI::Option>)
              ;
              uVar8 = ::std::__cxx11::string::empty();
              if ((uVar8 & 1) != 0) goto LAB_00120fa1;
            }
          }
          else {
LAB_00120fa1:
            psVar10 = Option::get_single_name_abi_cxx11_(this_00);
            ::std::__cxx11::string::string
                      ((string *)
                       &results.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)psVar10);
            uVar8 = ::std::__cxx11::string::empty();
            if ((uVar8 & 1) == 0) {
              Option::reduced_results_abi_cxx11_((results_t *)((long)&value.field_2 + 8),this_00);
              detail::ini_join((string *)local_368,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)((long)&value.field_2 + 8),this->arraySeparator,this->arrayStart,
                               this->arrayEnd,this->stringQuote,this->literalQuote);
              local_369 = 0;
              uVar8 = ::std::__cxx11::string::empty();
              if (((uVar8 & 1) != 0) && ((prefix_local._7_1_ & 1) != 0)) {
                Option::get_default_str_abi_cxx11_(&local_390,this_00);
                bVar4 = ::std::__cxx11::string::empty();
                ::std::__cxx11::string::~string((string *)&local_390);
                if (((bVar4 ^ 0xff) & 1) == 0) {
                  iVar5 = Option::get_expected_min(this_00);
                  if (iVar5 == 0) {
                    ::std::__cxx11::string::operator=((string *)local_368,"false");
                  }
                  else {
                    bVar3 = Option::get_run_callback_for_default(this_00);
                    if (!bVar3) {
                      bVar3 = OptionBase<CLI::Option>::get_required
                                        (&this_00->super_OptionBase<CLI::Option>);
                      if (bVar3) {
                        ::std::__cxx11::string::operator=((string *)local_368,"\"<REQUIRED>\"");
                        goto LAB_0012121e;
                      }
                    }
                    ::std::__cxx11::string::operator=((string *)local_368,"\"\"");
                  }
                }
                else {
                  Option::get_default_str_abi_cxx11_(&local_3d0,this_00);
                  detail::convert_arg_for_ini
                            (&local_3b0,&local_3d0,this->stringQuote,this->literalQuote,false);
                  ::std::__cxx11::string::operator=((string *)local_368,(string *)&local_3b0);
                  ::std::__cxx11::string::~string((string *)&local_3b0);
                  ::std::__cxx11::string::~string((string *)&local_3d0);
                }
LAB_0012121e:
                local_369 = 1;
              }
              uVar8 = ::std::__cxx11::string::empty();
              if ((uVar8 & 1) == 0) {
                this_01 = Option::get_fnames_abi_cxx11_(this_00);
                bVar3 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::empty(this_01);
                if (!bVar3) {
                  ::std::__cxx11::string::string((string *)&anon_var_0,(string *)local_368);
                  Option::get_flag_value
                            (&local_3f0,this_00,
                             (string *)
                             &results.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (string *)&anon_var_0);
                  ::std::__cxx11::string::operator=((string *)local_368,(string *)&local_3f0);
                  ::std::__cxx11::string::~string((string *)&local_3f0);
                  ::std::__cxx11::string::~string((string *)&anon_var_0);
                }
                if ((prefix_local._6_1_ & 1) != 0) {
                  bVar3 = Option::has_description(this_00);
                  if (bVar3) {
                    fVar13 = (fpos<__mbstate_t>)::std::ostream::tellp();
                    local_4b8[0] = fVar13;
                    std::fpos<__mbstate_t>::fpos(&local_4c8,0);
                    bVar3 = ::std::operator!=(local_4b8,&local_4c8);
                    if (bVar3) {
                      ::std::operator<<(local_1a8,'\n');
                    }
                    poVar12 = ::std::operator<<(local_1a8,(string *)local_1d8);
                    psVar10 = Option::get_description_abi_cxx11_(this_00);
                    ::std::__cxx11::string::string
                              ((string *)(name.field_2._M_local_buf + 8),(string *)psVar10);
                    detail::fix_newlines
                              (&local_4e8,(string *)local_1d8,(string *)((long)&name.field_2 + 8));
                    poVar12 = ::std::operator<<(poVar12,(string *)&local_4e8);
                    ::std::operator<<(poVar12,'\n');
                    ::std::__cxx11::string::~string((string *)&local_4e8);
                    ::std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
                  }
                }
                clean_name_string((string *)
                                  &results.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (string *)
                                  &groups.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_528,prefix,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&results.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
                if (((this->commentDefaultsBool & 1U) != 0) && ((local_369 & 1) != 0)) {
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&subcommands.
                                       super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   this->commentChar,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_528);
                  ::std::__cxx11::string::operator=
                            ((string *)local_528,
                             (string *)
                             &subcommands.
                              super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  ::std::__cxx11::string::~string
                            ((string *)
                             &subcommands.
                              super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                }
                poVar12 = ::std::operator<<(local_1a8,(string *)local_528);
                poVar12 = ::std::operator<<(poVar12,this->valueDelimiter);
                poVar12 = ::std::operator<<(poVar12,(string *)local_368);
                ::std::operator<<(poVar12,'\n');
                ::std::__cxx11::string::~string((string *)local_528);
              }
              ::std::__cxx11::string::~string((string *)local_368);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&value.field_2 + 8));
            }
            ::std::__cxx11::string::~string
                      ((string *)
                       &results.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
        ::operator++(&__end2);
      }
      std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~vector(&local_2d0);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::function<bool_(const_CLI::App_*)>::function((function<bool_(const_CLI::App_*)> *)&__range1_1)
  ;
  App::get_subcommands
            ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)local_560,pAVar1,
             (function<bool_(const_CLI::App_*)> *)&__range1_1);
  std::function<bool_(const_CLI::App_*)>::~function
            ((function<bool_(const_CLI::App_*)> *)&__range1_1);
  __end1_1 = std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::begin
                       ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)local_560);
  subcom = (App *)std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::end
                            ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)
                             local_560);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                        *)&subcom);
    if (!bVar3) break;
    ppAVar7 = __gnu_cxx::
              __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
              ::operator*(&__end1_1);
    local_5a0 = *ppAVar7;
    App::get_name_abi_cxx11_(local_5a0);
    uVar8 = ::std::__cxx11::string::empty();
    if ((uVar8 & 1) != 0) {
      if ((prefix_local._7_1_ & 1) == 0) {
        sVar9 = App::count_all(local_5a0);
        if (sVar9 == 0) goto LAB_00121bb6;
      }
      if ((prefix_local._6_1_ & 1) != 0) {
        App::get_group_abi_cxx11_(local_5a0);
        uVar8 = ::std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          poVar12 = ::std::operator<<(local_1a8,'\n');
          poVar12 = ::std::operator<<(poVar12,(string *)local_1d8);
          psVar10 = App::get_group_abi_cxx11_(local_5a0);
          poVar12 = ::std::operator<<(poVar12,(string *)psVar10);
          ::std::operator<<(poVar12," Options\n");
        }
      }
      bVar2 = prefix_local._7_1_;
      bVar4 = prefix_local._6_1_;
      pAVar1 = local_5a0;
      ::std::__cxx11::string::string((string *)&__range1_2,(string *)prefix);
      (**(this->super_Config)._vptr_Config)
                (local_5c0,this,pAVar1,(ulong)(bVar2 & 1),(ulong)(bVar4 & 1),&__range1_2);
      ::std::operator<<(local_1a8,local_5c0);
      ::std::__cxx11::string::~string(local_5c0);
      ::std::__cxx11::string::~string((string *)&__range1_2);
    }
LAB_00121bb6:
    __gnu_cxx::
    __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
    ::operator++(&__end1_1);
  }
  __end1_2 = std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::begin
                       ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)local_560);
  subcom_1 = (App *)std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::end
                              ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)
                               local_560);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                        *)&subcom_1);
    if (!bVar3) {
      outString.field_2._M_local_buf[0xf] = '\0';
      local_af1 = 0;
      if ((prefix_local._6_1_ & 1) != 0) {
        ::std::__cxx11::stringstream::str();
        outString.field_2._M_local_buf[0xf] = '\x01';
        local_af1 = ::std::__cxx11::string::empty();
        local_af1 = local_af1 ^ 0xff;
      }
      if ((outString.field_2._M_local_buf[0xf] & 1U) != 0) {
        ::std::__cxx11::string::~string(local_7b0);
      }
      if ((local_af1 & 1) == 0) {
        ::std::__cxx11::stringstream::str();
      }
      else {
        ::std::operator+(&local_818,this->commentChar,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1d8);
        ::std::operator+(&local_858,this->commentChar,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1d8);
        App::get_description_abi_cxx11_(&local_878,pAStack_20);
        detail::fix_newlines(&local_838,&local_858,&local_878);
        ::std::operator+(&local_7f8,&local_818,&local_838);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_7d8,&local_7f8,'\n');
        ::std::__cxx11::string::~string((string *)&local_7f8);
        ::std::__cxx11::string::~string((string *)&local_838);
        ::std::__cxx11::string::~string((string *)&local_878);
        ::std::__cxx11::string::~string((string *)&local_858);
        ::std::__cxx11::string::~string((string *)&local_818);
        ::std::__cxx11::stringstream::str();
        ::std::operator+(__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_7d8,&local_898);
        ::std::__cxx11::string::~string((string *)&local_898);
        ::std::__cxx11::string::~string((string *)local_7d8);
      }
      std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::~vector
                ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)local_560);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_248);
      ::std::__cxx11::string::~string
                ((string *)
                 &groups.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string(local_208);
      ::std::__cxx11::string::~string((string *)local_1d8);
      ::std::__cxx11::stringstream::~stringstream
                ((stringstream *)(commentLead.field_2._M_local_buf + 8));
      return __return_storage_ptr__;
    }
    ppAVar7 = __gnu_cxx::
              __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
              ::operator*(&__end1_2);
    pAVar1 = *ppAVar7;
    App::get_name_abi_cxx11_(pAVar1);
    uVar8 = ::std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      if ((prefix_local._7_1_ & 1) == 0) {
        sVar9 = App::count_all(pAVar1);
        if (sVar9 == 0) goto LAB_00122325;
      }
      psVar10 = App::get_name_abi_cxx11_(pAVar1);
      ::std::__cxx11::string::string((string *)(appname.field_2._M_local_buf + 8),(string *)psVar10)
      ;
      clean_name_string((string *)((long)&appname.field_2 + 8),
                        (string *)
                        &groups.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar3 = App::get_configurable(pAVar1);
      if (bVar3) {
        if ((prefix_local._7_1_ & 1) == 0) {
          bVar3 = App::got_subcommand(pAStack_20,pAVar1);
          if (!bVar3) goto LAB_001221be;
        }
        uVar8 = ::std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
LAB_00121d47:
          poVar12 = ::std::operator<<(local_1a8,'[');
          poVar12 = ::std::operator<<(poVar12,(string *)prefix);
          poVar12 = ::std::operator<<(poVar12,(string *)(appname.field_2._M_local_buf + 8));
          ::std::operator<<(poVar12,"]\n");
        }
        else {
          pAVar11 = App::get_parent(pAStack_20);
          if (pAVar11 == (App *)0x0) goto LAB_00121d47;
          psVar10 = App::get_name_abi_cxx11_(pAStack_20);
          ::std::__cxx11::string::string((string *)local_640,(string *)psVar10);
          clean_name_string((string *)local_640,
                            (string *)
                            &groups.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_640,this->parentSeparatorChar);
          ::std::operator+(&local_660,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&appname.field_2 + 8));
          ::std::__cxx11::string::operator=
                    ((string *)(appname.field_2._M_local_buf + 8),(string *)&local_660);
          ::std::__cxx11::string::~string((string *)&local_660);
          ::std::__cxx11::string::~string((string *)&p);
          pname.field_2._8_8_ = App::get_parent(pAStack_20);
          while( true ) {
            pAVar11 = App::get_parent((App *)pname.field_2._8_8_);
            if (pAVar11 == (App *)0x0) break;
            psVar10 = App::get_name_abi_cxx11_((App *)pname.field_2._8_8_);
            ::std::__cxx11::string::string((string *)local_6a8,(string *)psVar10);
            clean_name_string((string *)local_6a8,
                              (string *)
                              &groups.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
            ::std::operator+(&local_6e8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_6a8,this->parentSeparatorChar);
            ::std::operator+(&local_6c8,&local_6e8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&appname.field_2 + 8));
            ::std::__cxx11::string::operator=
                      ((string *)(appname.field_2._M_local_buf + 8),(string *)&local_6c8);
            ::std::__cxx11::string::~string((string *)&local_6c8);
            ::std::__cxx11::string::~string((string *)&local_6e8);
            pname.field_2._8_8_ = (size_type)App::get_parent(pname.field_2._8_8_);
            ::std::__cxx11::string::~string((string *)local_6a8);
          }
          poVar12 = ::std::operator<<(local_1a8,'[');
          poVar12 = ::std::operator<<(poVar12,(string *)(appname.field_2._M_local_buf + 8));
          ::std::operator<<(poVar12,"]\n");
          ::std::__cxx11::string::~string((string *)local_640);
        }
        bVar2 = prefix_local._7_1_;
        bVar4 = prefix_local._6_1_;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_728,"",&local_729);
        (**(this->super_Config)._vptr_Config)
                  (local_708,this,pAVar1,(ulong)(bVar2 & 1),(ulong)(bVar4 & 1),local_728);
        ::std::operator<<(local_1a8,local_708);
        ::std::__cxx11::string::~string(local_708);
        ::std::__cxx11::string::~string(local_728);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_729);
      }
      else {
LAB_001221be:
        bVar2 = prefix_local._7_1_;
        bVar4 = prefix_local._6_1_;
        ::std::operator+(&local_790,prefix,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&appname.field_2 + 8));
        ::std::operator+(&local_770,&local_790,this->parentSeparatorChar);
        (**(this->super_Config)._vptr_Config)
                  (local_750,this,pAVar1,(ulong)(bVar2 & 1),(ulong)(bVar4 & 1),&local_770);
        ::std::operator<<(local_1a8,local_750);
        ::std::__cxx11::string::~string(local_750);
        ::std::__cxx11::string::~string((string *)&local_770);
        ::std::__cxx11::string::~string((string *)&local_790);
      }
      ::std::__cxx11::string::~string((string *)(appname.field_2._M_local_buf + 8));
    }
LAB_00122325:
    __gnu_cxx::
    __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
    ::operator++(&__end1_2);
  } while( true );
}

Assistant:

CLI11_INLINE std::string
ConfigBase::to_config(const App *app, bool default_also, bool write_description, std::string prefix) const {
    std::stringstream out;
    std::string commentLead;
    commentLead.push_back(commentChar);
    commentLead.push_back(' ');

    std::string commentTest = "#;";
    commentTest.push_back(commentChar);
    commentTest.push_back(parentSeparatorChar);

    std::string keyChars = commentTest;
    keyChars.push_back(literalQuote);
    keyChars.push_back(stringQuote);
    keyChars.push_back(arrayStart);
    keyChars.push_back(arrayEnd);
    keyChars.push_back(valueDelimiter);
    keyChars.push_back(arraySeparator);

    std::vector<std::string> groups = app->get_groups();
    bool defaultUsed = false;
    groups.insert(groups.begin(), std::string("OPTIONS"));

    for(auto &group : groups) {
        if(group == "OPTIONS" || group.empty()) {
            if(defaultUsed) {
                continue;
            }
            defaultUsed = true;
        }
        if(write_description && group != "OPTIONS" && !group.empty()) {
            out << '\n' << commentChar << commentLead << group << " Options\n";
        }
        for(const Option *opt : app->get_options({})) {
            // Only process options that are configurable
            if(opt->get_configurable()) {
                if(opt->get_group() != group) {
                    if(!(group == "OPTIONS" && opt->get_group().empty())) {
                        continue;
                    }
                }
                std::string single_name = opt->get_single_name();
                if(single_name.empty()) {
                    continue;
                }

                auto results = opt->reduced_results();
                std::string value =
                    detail::ini_join(results, arraySeparator, arrayStart, arrayEnd, stringQuote, literalQuote);

                bool isDefault = false;
                if(value.empty() && default_also) {
                    if(!opt->get_default_str().empty()) {
                        value = detail::convert_arg_for_ini(opt->get_default_str(), stringQuote, literalQuote, false);
                    } else if(opt->get_expected_min() == 0) {
                        value = "false";
                    } else if(opt->get_run_callback_for_default() || !opt->get_required()) {
                        value = "\"\"";  // empty string default value
                    } else {
                        value = "\"<REQUIRED>\"";
                    }
                    isDefault = true;
                }

                if(!value.empty()) {
                    if(!opt->get_fnames().empty()) {
                        try {
                            value = opt->get_flag_value(single_name, value);
                        } catch(const CLI::ArgumentMismatch &) {
                            bool valid{false};
                            for(const auto &test_name : opt->get_fnames()) {
                                try {
                                    value = opt->get_flag_value(test_name, value);
                                    single_name = test_name;
                                    valid = true;
                                } catch(const CLI::ArgumentMismatch &) {
                                    continue;
                                }
                            }
                            if(!valid) {
                                value = detail::ini_join(
                                    opt->results(), arraySeparator, arrayStart, arrayEnd, stringQuote, literalQuote);
                            }
                        }
                    }
                    if(write_description && opt->has_description()) {
                        if(out.tellp() != std::streampos(0)) {
                            out << '\n';
                        }
                        out << commentLead << detail::fix_newlines(commentLead, opt->get_description()) << '\n';
                    }
                    clean_name_string(single_name, keyChars);

                    std::string name = prefix + single_name;
                    if(commentDefaultsBool && isDefault) {
                        name = commentChar + name;
                    }
                    out << name << valueDelimiter << value << '\n';
                }
            }
        }
    }

    auto subcommands = app->get_subcommands({});
    for(const App *subcom : subcommands) {
        if(subcom->get_name().empty()) {
            if(!default_also && (subcom->count_all() == 0)) {
                continue;
            }
            if(write_description && !subcom->get_group().empty()) {
                out << '\n' << commentLead << subcom->get_group() << " Options\n";
            }
            /*if (!prefix.empty() || app->get_parent() == nullptr) {
                out << '[' << prefix << "___"<< subcom->get_group() << "]\n";
            } else {
                std::string subname = app->get_name() + parentSeparatorChar + "___"+subcom->get_group();
                const auto *p = app->get_parent();
                while(p->get_parent() != nullptr) {
                    subname = p->get_name() + parentSeparatorChar +subname;
                    p = p->get_parent();
                }
                out << '[' << subname << "]\n";
            }
            */
            out << to_config(subcom, default_also, write_description, prefix);
        }
    }

    for(const App *subcom : subcommands) {
        if(!subcom->get_name().empty()) {
            if(!default_also && (subcom->count_all() == 0)) {
                continue;
            }
            std::string subname = subcom->get_name();
            clean_name_string(subname, keyChars);

            if(subcom->get_configurable() && (default_also || app->got_subcommand(subcom))) {
                if(!prefix.empty() || app->get_parent() == nullptr) {

                    out << '[' << prefix << subname << "]\n";
                } else {
                    std::string appname = app->get_name();
                    clean_name_string(appname, keyChars);
                    subname = appname + parentSeparatorChar + subname;
                    const auto *p = app->get_parent();
                    while(p->get_parent() != nullptr) {
                        std::string pname = p->get_name();
                        clean_name_string(pname, keyChars);
                        subname = pname + parentSeparatorChar + subname;
                        p = p->get_parent();
                    }
                    out << '[' << subname << "]\n";
                }
                out << to_config(subcom, default_also, write_description, "");
            } else {
                out << to_config(subcom, default_also, write_description, prefix + subname + parentSeparatorChar);
            }
        }
    }

    if(write_description && !out.str().empty()) {
        std::string outString =
            commentChar + commentLead + detail::fix_newlines(commentChar + commentLead, app->get_description()) + '\n';
        return outString + out.str();
    }
    return out.str();
}